

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O3

size_t __thiscall groundupdbext::HighwayHash::operator()(HighwayHash *this,char *data,size_t length)

{
  uint64_t *puVar1;
  uint *puVar2;
  uint *puVar3;
  undefined4 uVar4;
  HighwayHashCatT<1U> *__dest;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  long lVar13;
  size_t sVar14;
  HHStateT<1U> *pHVar15;
  HHStatePortable *pHVar16;
  byte bVar17;
  Lanes rotated_keys;
  uint64_t local_d8;
  uint64_t uStack_d0;
  uint64_t local_c8;
  uint64_t uStack_c0;
  HHStatePortable local_b8;
  
  bVar17 = 0;
  __dest = this->m_hh;
  lVar13 = 0;
  do {
    puVar1 = this->m_key + lVar13;
    uVar11 = *puVar1;
    uVar4 = *(undefined4 *)((long)puVar1 + 4);
    uVar12 = puVar1[1];
    *(undefined4 *)(local_b8.v0 + lVar13) = uVar4;
    *(int *)((long)local_b8.v0 + lVar13 * 8 + 4) = (int)uVar11;
    *(undefined4 *)(local_b8.v0 + lVar13 + 1) = uVar4;
    *(int *)((long)local_b8.v0 + lVar13 * 8 + 0xc) = (int)uVar12;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 4);
  (__dest->state_).mul0[2] = 0x13198a2e03707344;
  (__dest->state_).mul0[3] = 0x243f6a8885a308d3;
  (__dest->state_).mul0[0] = 0xdbe6d5d5fe4cce2f;
  (__dest->state_).mul0[1] = 0xa4093822299f31d0;
  (__dest->state_).mul1[0] = 0x3bd39e10cb0ef593;
  (__dest->state_).mul1[1] = 0xc0acf169b5f18a8c;
  (__dest->state_).mul1[2] = 0xbe5466cf34e90c6c;
  (__dest->state_).mul1[3] = 0x452821e638d01377;
  lVar13 = 0;
  do {
    puVar2 = (uint *)((long)this->m_key + lVar13);
    uVar5 = puVar2[1];
    uVar6 = puVar2[2];
    uVar7 = puVar2[3];
    uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar13 + 4);
    uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar13 + 8);
    uVar10 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                      lVar13 + 0xc);
    puVar3 = (uint *)((long)(__dest->state_).v0 + lVar13);
    *puVar3 = *puVar2 ^ *(uint *)(highwayhash::Portable::HHStatePortable::
                                  Reset(unsigned_long_const*)::init0 + lVar13);
    puVar3[1] = uVar5 ^ uVar8;
    puVar3[2] = uVar6 ^ uVar9;
    puVar3[3] = uVar7 ^ uVar10;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x20);
  lVar13 = 0;
  do {
    uVar5 = *(uint *)((long)local_b8.v0 + lVar13 + 4);
    uVar6 = *(uint *)((long)local_b8.v0 + lVar13 + 8);
    uVar7 = *(uint *)((long)local_b8.v0 + lVar13 + 0xc);
    uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar13 + 4);
    uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar13 + 8);
    uVar10 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                      lVar13 + 0xc);
    puVar2 = (uint *)((long)(__dest->state_).v1 + lVar13);
    *puVar2 = *(uint *)((long)local_b8.v0 + lVar13) ^
              *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                       lVar13);
    puVar2[1] = uVar5 ^ uVar8;
    puVar2[2] = uVar6 ^ uVar9;
    puVar2[3] = uVar7 ^ uVar10;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x20);
  __dest->buffer_usage_ = 0;
  if (length < 0x20) {
    if (length == 0) {
      sVar14 = 0;
    }
    else {
      memcpy(__dest,data,length);
      sVar14 = __dest->buffer_usage_;
    }
    __dest->buffer_usage_ = sVar14 + length;
  }
  else {
    pHVar15 = &__dest->state_;
    pHVar16 = &local_b8;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pHVar16->v0[0] = pHVar15->v0[0];
      pHVar15 = (HHStateT<1U> *)(pHVar15->v0 + 1);
      pHVar16 = (HHStatePortable *)(pHVar16->v0 + 1);
    }
    do {
      local_d8 = *(uint64_t *)data;
      uStack_d0 = *(uint64_t *)((long)data + 8);
      local_c8 = *(uint64_t *)((long)data + 0x10);
      uStack_c0 = *(uint64_t *)((long)data + 0x18);
      highwayhash::Portable::HHStatePortable::Update(&local_b8,(Lanes *)&local_d8);
      data = (char *)((long)data + 0x20);
      length = length - 0x20;
    } while (0x1f < length);
    __dest->buffer_usage_ = length;
    pHVar16 = &local_b8;
    pHVar15 = &__dest->state_;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      pHVar15->v0[0] = pHVar16->v0[0];
      pHVar16 = (HHStatePortable *)((long)pHVar16 + ((ulong)bVar17 * -2 + 1) * 8);
      pHVar15 = (HHStateT<1U> *)((long)pHVar15 + (ulong)bVar17 * -0x10 + 8);
    }
    if (length != 0) {
      memcpy(__dest,data,length);
    }
  }
  highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(this->m_hh,this->m_result);
  return *this->m_result;
}

Assistant:

std::size_t
HighwayHash::operator() (const char* data,std::size_t length) const noexcept {
  m_hh->Reset(m_key);
  m_hh->Append(data, length);
  m_hh->Finalize(m_result);
  return *m_result;
}